

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

void __thiscall SQCompiler::DeleteExpr(SQCompiler *this)

{
  SQInteger SVar1;
  bool bVar2;
  undefined7 uVar3;
  SQInteger SVar4;
  ulong uVar5;
  SQExpState es;
  
  SVar4 = SQLexer::Lex(&this->_lex);
  this->_token = SVar4;
  SVar4 = (this->_es).etype;
  SVar1 = (this->_es).epos;
  bVar2 = (this->_es).donot_get;
  uVar3 = *(undefined7 *)&(this->_es).field_0x11;
  (this->_es).donot_get = true;
  PrefixedExpr(this);
  uVar5 = (this->_es).etype;
  if (uVar5 == 1) {
    Error(this,"can\'t delete an expression");
    uVar5 = (this->_es).etype;
  }
  if ((uVar5 & 0xfffffffffffffffe) == 2) {
    Emit2ArgsOP(this,_OP_DELETE,0);
  }
  else {
    Error(this,"cannot delete an (outer) local");
  }
  (this->_es).donot_get = bVar2;
  *(undefined7 *)&(this->_es).field_0x11 = uVar3;
  (this->_es).etype = SVar4;
  (this->_es).epos = SVar1;
  return;
}

Assistant:

void DeleteExpr()
    {
        SQExpState es;
        Lex();
        es = _es;
        _es.donot_get = true;
        PrefixedExpr();
        if(_es.etype==EXPR) Error(_SC("can't delete an expression"));
        if(_es.etype==OBJECT || _es.etype==BASE) {
            Emit2ArgsOP(_OP_DELETE);
        }
        else {
            Error(_SC("cannot delete an (outer) local"));
        }
        _es = es;
    }